

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  size_t __n;
  vector *pvVar1;
  char cVar2;
  int iVar3;
  uint __seed;
  MemStatic *this;
  undefined *puVar4;
  ostream *poVar5;
  uint64_t time_offset;
  int *piVar6;
  Image *pIVar7;
  undefined8 uVar8;
  Decompiler *pDVar9;
  char *file_name;
  ulong uVar10;
  long *plVar11;
  string self_symbol;
  string stdout_symbol;
  string stdin_symbol;
  string error;
  vector<r_code::Code_*> ram_objects;
  Settings settings;
  ifstream infile;
  Decompiler decompiler;
  Metadata metadata;
  Image seed;
  undefined4 in_stack_fffffffffffff74c;
  DebugStream local_889;
  vector *local_888;
  ulong local_880;
  ulong local_878;
  int local_86c;
  char **local_868;
  undefined1 *local_860;
  undefined1 *local_858;
  undefined1 *local_850;
  undefined1 *local_848;
  size_t local_840;
  undefined1 local_838 [16];
  undefined1 *local_828;
  size_t local_820;
  undefined1 local_818 [16];
  undefined1 *local_808;
  size_t local_800;
  undefined1 local_7f8 [16];
  char *local_7e8;
  long local_7e0;
  char local_7d8 [16];
  undefined1 *local_7c8;
  long local_7c0;
  undefined1 local_7b8 [16];
  undefined1 *local_7a8;
  long local_7a0;
  undefined1 local_798 [16];
  undefined1 *local_788;
  long local_780;
  undefined1 local_778 [16];
  undefined1 *local_768;
  long local_760;
  undefined1 local_758 [16];
  undefined1 *local_748;
  long local_740;
  undefined1 local_738 [16];
  void *local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined1 local_710 [216];
  bool local_638;
  ulong local_630;
  ulong uStack_628;
  bool local_610;
  bool local_60f;
  bool local_60e;
  _Alloc_hider local_608;
  size_type local_600;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5f8;
  bool local_5e8;
  bool local_5e7;
  string local_5e0;
  bool local_5c0;
  ulong local_5b8;
  ulong local_5b0;
  bool local_5a8;
  bool local_5a7;
  bool local_5a6;
  bool local_5a5;
  string local_5a0;
  bool local_580;
  timespec local_578;
  char local_568 [16];
  int aiStack_558 [122];
  DebugStream local_370 [336];
  Metadata local_220 [56];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1e8 [56];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_1b0 [56];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148 [24];
  vector<r_comp::Class,_std::allocator<r_comp::Class>_> local_130 [24];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_118 [56];
  Image local_e0 [128];
  long *local_60;
  
  local_710._0_8_ = local_710 + 0x10;
  local_710._8_8_ = 0;
  local_710[0x10] = '\0';
  local_710._32_8_ = local_710 + 0x30;
  local_710._40_8_ = 0;
  local_710[0x30] = '\0';
  local_710._64_8_ = local_710 + 0x50;
  local_710._72_8_ = 0;
  local_710[0x50] = '\0';
  local_608._M_p = (pointer)&local_5f8;
  local_600 = 0;
  local_5f8._M_local_buf[0] = '\0';
  local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
  local_5e0._M_string_length = 0;
  local_5e0.field_2._M_local_buf[0] = '\0';
  local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
  local_5a0._M_string_length = 0;
  local_5a0.field_2._M_local_buf[0] = '\0';
  file_name = "settings.ini";
  std::ifstream::ifstream(&local_578,"settings.ini",_S_in);
  iVar3 = *(int *)((long)aiStack_558 + *(long *)(local_578.tv_sec + -0x18));
  std::ifstream::~ifstream(&local_578);
  if (iVar3 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"loading from home",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    file_name = "~/.config/replicode/replicode.conf";
  }
  Settings::load((Settings *)local_710,file_name);
  r_comp::Image::Image(local_e0);
  r_comp::Metadata::Metadata(local_220);
  local_748 = local_738;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_748,"main","");
  local_578.tv_sec = (__time_t)local_568;
  std::__cxx11::string::_M_construct<char*>((string *)&local_578,local_748,local_748 + local_740);
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&s_debugSection);
  if (iVar3 != 0) {
    iVar3 = std::__throw_system_error(iVar3);
LAB_0010e7d2:
    iVar3 = std::__throw_system_error(iVar3);
LAB_0010e7d9:
    iVar3 = std::__throw_system_error(iVar3);
LAB_0010e7e0:
    iVar3 = std::__throw_system_error(iVar3);
LAB_0010e7e7:
    uVar8 = std::__throw_system_error(iVar3);
    std::ofstream::~ofstream(&local_578);
    if (local_848 != local_838) {
      operator_delete(local_848);
    }
    if (local_828 != local_818) {
      operator_delete(local_828);
    }
    if (local_808 != local_7f8) {
      operator_delete(local_808);
    }
    if (local_728 != (void *)0x0) {
      operator_delete(local_728);
    }
    r_comp::Decompiler::~Decompiler((Decompiler *)local_370);
    if (local_7e8 != local_7d8) {
      operator_delete(local_7e8);
    }
    r_comp::Metadata::~Metadata(local_220);
    r_comp::Image::~Image(local_e0);
    Settings::~Settings((Settings *)local_710);
    _Unwind_Resume(uVar8);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_578.tv_sec,local_578.tv_nsec);
  if ((char *)local_578.tv_sec != local_568) {
    operator_delete((void *)local_578.tv_sec);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Initializing with user operator library and user class code...",
             0x3e);
  DebugStream::~DebugStream(local_370);
  if (local_748 != local_738) {
    operator_delete(local_748);
  }
  cVar2 = r_exec::Init((char *)local_710._0_8_,main::anon_class_1_0_00000001::__invoke,
                       (char *)local_710._32_8_,local_e0,local_220);
  iVar3 = 2;
  if (cVar2 == '\0') goto LAB_0010e6a5;
  __seed = (*r_exec::Now)();
  srand(__seed);
  local_768 = local_758;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_768,"main","");
  local_578.tv_sec = (__time_t)local_568;
  std::__cxx11::string::_M_construct<char*>((string *)&local_578,local_768,local_768 + local_760);
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&s_debugSection);
  if (iVar3 != 0) goto LAB_0010e7d2;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_578.tv_sec,local_578.tv_nsec);
  if ((char *)local_578.tv_sec != local_568) {
    operator_delete((void *)local_578.tv_sec);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"compiling source...",0x13);
  DebugStream::~DebugStream(local_370);
  if (local_768 != local_758) {
    operator_delete(local_768);
  }
  local_7e8 = local_7d8;
  local_7e0 = 0;
  local_7d8[0] = '\0';
  cVar2 = r_exec::Compile((char *)local_710._64_8_,(string *)&local_7e8,local_e0,local_220,false);
  if (cVar2 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," <- ",4);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_7e8,local_7e0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    iVar3 = 3;
    std::ostream::flush();
  }
  else {
    local_788 = local_778;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_788,"main","");
    local_578.tv_sec = (__time_t)local_568;
    std::__cxx11::string::_M_construct<char*>((string *)&local_578,local_788,local_788 + local_780);
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)&s_debugSection);
    if (iVar3 != 0) goto LAB_0010e7d9;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)local_578.tv_sec,local_578.tv_nsec);
    if ((char *)local_578.tv_sec != local_568) {
      operator_delete((void *)local_578.tv_sec);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"source compiled!",0x10);
    DebugStream::~DebugStream(local_370);
    if (local_788 != local_778) {
      operator_delete(local_788);
    }
    r_comp::Decompiler::Decompiler((Decompiler *)local_370);
    r_comp::Decompiler::init((Metadata *)local_370);
    if (local_610 == true) {
      this = (MemStatic *)operator_new(0x510);
      r_exec::MemStatic::MemStatic(this);
      puVar4 = &r_exec::Mem<r_exec::LObject,r_exec::MemStatic>::vtable;
    }
    else {
      this = (MemStatic *)operator_new(0x4e8);
      r_exec::MemVolatile::MemVolatile((MemVolatile *)this);
      puVar4 = &r_exec::Mem<r_exec::LObject,r_exec::MemVolatile>::vtable;
    }
    *(undefined **)this = puVar4 + 0x10;
    local_728 = (void *)0x0;
    uStack_720 = 0;
    local_718 = 0;
    local_86c = argc;
    r_comp::Image::get_objects((Mem *)local_e0,(vector *)this);
    *(Metadata **)((vector *)this + 0x4d8) = local_220;
    local_888 = (vector *)this;
    r_exec::_Mem::init((ulong)this,local_710._96_8_,local_710._104_8_,(double)local_710._120_8_,
                       local_710._112_8_,(double)local_710._136_8_,local_710._128_8_,
                       local_710._144_8_,(double)local_710._160_8_,local_710._152_8_,
                       local_710._168_8_,(double)local_710._184_8_,local_710._176_8_,
                       local_710._192_8_,local_710._200_8_,(bool)local_710[0xd0],
                       CONCAT44(in_stack_fffffffffffff74c,(uint)local_638),local_630,uStack_628,
                       local_5b0);
    local_808 = local_7f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_808,"stdin","");
    local_828 = local_818;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_828,"stdout","");
    local_848 = local_838;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_848,"self","");
    local_868 = argv;
    if (local_60 == (long *)0x0) {
      local_880 = 0;
      local_878 = 0;
      uVar10 = 0;
    }
    else {
      local_850 = local_808;
      local_858 = local_828;
      local_860 = local_848;
      uVar10 = 0;
      local_878 = 0;
      local_880 = 0;
      plVar11 = local_60;
      do {
        __n = plVar11[3];
        if ((__n == local_800) &&
           ((__n == 0 || (iVar3 = bcmp((void *)plVar11[2],local_850,__n), iVar3 == 0)))) {
          uVar10 = (ulong)*(uint *)(plVar11 + 1);
        }
        else if ((__n == local_820) &&
                ((__n == 0 || (iVar3 = bcmp((void *)plVar11[2],local_858,__n), iVar3 == 0)))) {
          local_878 = (ulong)*(uint *)(plVar11 + 1);
        }
        else if ((__n == local_840) &&
                ((__n == 0 || (iVar3 = bcmp((void *)plVar11[2],local_860,__n), iVar3 == 0)))) {
          local_880 = (ulong)*(uint *)(plVar11 + 1);
        }
        plVar11 = (long *)*plVar11;
      } while (plVar11 != (long *)0x0);
    }
    cVar2 = r_exec::_Mem::load((vector *)local_888,(ulong)&local_728,uVar10,local_878);
    iVar3 = 4;
    if (cVar2 != '\0') {
      time_offset = r_exec::_Mem::start();
      local_7a8 = local_798;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7a8,"main","");
      local_578.tv_sec = (__time_t)local_568;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_578,local_7a8,local_7a8 + local_7a0);
      iVar3 = pthread_mutex_lock((pthread_mutex_t *)&s_debugSection);
      if (iVar3 != 0) goto LAB_0010e7e0;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)local_578.tv_sec,local_578.tv_nsec);
      if ((char *)local_578.tv_sec != local_568) {
        operator_delete((void *)local_578.tv_sec);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"running for",0xb);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ms",2);
      DebugStream::~DebugStream(&local_889);
      if (local_7a8 != local_798) {
        operator_delete(local_7a8);
      }
      if (0 < (long)local_5b8) {
        local_578.tv_sec = local_5b8 / 1000;
        local_578.tv_nsec = (local_5b8 % 1000) * 1000000;
        do {
          iVar3 = nanosleep(&local_578,&local_578);
          if (iVar3 != -1) break;
          piVar6 = __errno_location();
        } while (*piVar6 == 4);
      }
      local_7c8 = local_7b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_7c8,"main","");
      local_578.tv_sec = (__time_t)local_568;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_578,local_7c8,local_7c8 + local_7c0);
      iVar3 = pthread_mutex_lock((pthread_mutex_t *)&s_debugSection);
      if (iVar3 != 0) goto LAB_0010e7e7;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)local_578.tv_sec,local_578.tv_nsec);
      if ((char *)local_578.tv_sec != local_568) {
        operator_delete((void *)local_578.tv_sec);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"shutting rMem down...",0x15);
      DebugStream::~DebugStream(&local_889);
      if (local_7c8 != local_7b8) {
        operator_delete(local_7c8);
      }
      pvVar1 = local_888;
      r_exec::_Mem::stop();
      if (local_610 == true) {
        pIVar7 = (Image *)(**(code **)(*(long *)pvVar1 + 0x58))(pvVar1);
        if (local_5e7 == true) {
          pDVar9 = (Decompiler *)0x0;
          if (local_5c0 != false) {
            pDVar9 = (Decompiler *)local_370;
          }
          write_to_file(pIVar7,&local_5e0,pDVar9,time_offset);
        }
        if ((local_60f == true) && ((local_5e7 != true || (local_5c0 == false)))) {
          if (local_60e == true) {
            std::ofstream::ofstream(&local_578);
            std::ofstream::open((char *)&local_578,(_Ios_Openmode)local_608._M_p);
            std::ios::rdbuf((streambuf *)((long)&std::cout + *(long *)(std::cout + -0x18)));
            decompile((Decompiler *)local_370,pIVar7,time_offset,local_5e8);
            std::ios::rdbuf((streambuf *)((long)&std::cout + *(long *)(std::cout + -0x18)));
            std::ofstream::close();
            std::ofstream::~ofstream(&local_578);
          }
          else {
            decompile((Decompiler *)local_370,pIVar7,time_offset,local_5e8);
          }
        }
        if (pIVar7 != (Image *)0x0) {
          r_comp::Image::~Image(pIVar7);
          operator_delete(pIVar7);
        }
      }
      if (local_5a8 == true) {
        pIVar7 = (Image *)r_exec::_Mem::get_models();
        if (local_5a5 == true) {
          pDVar9 = (Decompiler *)0x0;
          if (local_580 != false) {
            pDVar9 = (Decompiler *)local_370;
          }
          write_to_file(pIVar7,&local_5a0,pDVar9,time_offset);
        }
        if ((local_5a7 == true) && ((local_5a5 != true || (local_580 == false)))) {
          if (local_86c < 3) {
            decompile((Decompiler *)local_370,pIVar7,time_offset,local_5a6);
          }
          else {
            std::ofstream::ofstream(&local_578);
            std::ofstream::open((char *)&local_578,(_Ios_Openmode)local_868[2]);
            std::ios::rdbuf((streambuf *)((long)&std::cout + *(long *)(std::cout + -0x18)));
            decompile((Decompiler *)local_370,pIVar7,time_offset,local_5a6);
            std::ios::rdbuf((streambuf *)((long)&std::cout + *(long *)(std::cout + -0x18)));
            std::ofstream::close();
            std::ofstream::~ofstream(&local_578);
          }
        }
        if (pIVar7 != (Image *)0x0) {
          r_comp::Image::~Image(pIVar7);
          operator_delete(pIVar7);
        }
      }
      r_comp::RepliStruct::cleanup();
      (**(code **)(*(long *)pvVar1 + 0x28))(pvVar1);
      iVar3 = 0;
    }
    if (local_848 != local_838) {
      operator_delete(local_848);
    }
    if (local_828 != local_818) {
      operator_delete(local_828);
    }
    if (local_808 != local_7f8) {
      operator_delete(local_808);
    }
    if (local_728 != (void *)0x0) {
      operator_delete(local_728);
    }
    r_comp::Decompiler::~Decompiler((Decompiler *)local_370);
  }
  if (local_7e8 != local_7d8) {
    operator_delete(local_7e8);
  }
LAB_0010e6a5:
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(local_118);
  std::vector<r_comp::Class,_std::allocator<r_comp::Class>_>::~vector(local_130);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_148);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_160);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_178);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Reference>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(local_1b0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(local_1e8);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_220);
  r_comp::Image::~Image(local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
    operator_delete(local_5a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
    operator_delete(local_5e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_p != &local_5f8) {
    operator_delete(local_608._M_p);
  }
  if ((undefined1 *)local_710._64_8_ != local_710 + 0x50) {
    operator_delete((void *)local_710._64_8_);
  }
  if ((undefined1 *)local_710._32_8_ != local_710 + 0x30) {
    operator_delete((void *)local_710._32_8_);
  }
  if ((undefined1 *)local_710._0_8_ != local_710 + 0x10) {
    operator_delete((void *)local_710._0_8_);
  }
  return iVar3;
}

Assistant:

int main(int argc, char **argv)
{
    Settings settings;

    // First try to load local config, otherwise user config, otherwise just
    // use default values
    if (fileExists("settings.ini")) {
        settings.load("settings.ini");
    } else {
        std::cout << "loading from home" << std::endl;
        settings.load("~/.config/replicode/replicode.conf");
    }

    r_comp::Image seed;
    r_comp::Metadata metadata;
    debug("main") << "Initializing with user operator library and user class code...";
    using namespace std::chrono;

    if (!r_exec::Init(settings.usr_operator_path.c_str(),
                      []() -> uint64_t {
                         return duration_cast<microseconds>(high_resolution_clock::now().time_since_epoch()).count();
                      },
                      settings.usr_class_path.c_str(),
                      &seed,
                      &metadata)) {
        return 2;
    }
    srand(r_exec::Now());
    debug("main") << "compiling source...";
    std::string error;

    if (!r_exec::Compile(settings.source_file_name.c_str(), error, &seed, &metadata, false)) {
        std::cerr << " <- " << error << std::endl;
        return 3;
    }

    debug("main") << "source compiled!";
#if defined(WIN32) || defined(WIN64)
    r_exec::PipeOStream::Open(settings.debug_windows);
#endif
    Decompiler decompiler;
    decompiler.init(&metadata);
    r_exec::_Mem *mem;

    if (settings.get_objects) {
        mem = new r_exec::Mem<r_exec::LObject, r_exec::MemStatic>();
    } else {
        mem = new r_exec::Mem<r_exec::LObject, r_exec::MemVolatile>();
    }

    r_code::vector<r_code::Code *> ram_objects;
    seed.get_objects(mem, ram_objects);
    mem->metadata = &metadata;
    mem->init(settings.base_period,
              settings.reduction_core_count,
              settings.time_core_count,
              settings.mdl_inertia_sr_thr,
              settings.mdl_inertia_cnt_thr,
              settings.tpx_dsr_thr,
              settings.min_sim_time_horizon,
              settings.max_sim_time_horizon,
              settings.sim_time_horizon,
              settings.tpx_time_horizon,
              settings.perf_sampling_period,
              settings.float_tolerance,
              settings.time_tolerance,
              settings.primary_thz,
              settings.secondary_thz,
              settings.debug,
              settings.ntf_mk_resilience,
              settings.goal_pred_success_resilience,
              settings.probe_level,
              settings.trace_levels);
    uint64_t stdin_oid = 0;
    std::string stdin_symbol("stdin");
    uint64_t stdout_oid = 0;
    std::string stdout_symbol("stdout");
    uint64_t self_oid = 0;
    std::string self_symbol("self");
    std::unordered_map<uintptr_t, std::string>::const_iterator n;

    for (const auto &symbol : seed.object_names.symbols) {
        if (symbol.second == stdin_symbol) {
            stdin_oid = symbol.first;
        } else if (symbol.second == stdout_symbol) {
            stdout_oid = symbol.first;
        } else if (symbol.second == self_symbol) {
            self_oid = symbol.first;
        }
    }

    if (!mem->load(ram_objects.as_std(), stdin_oid, stdout_oid, self_oid)) {
        return 4;
    }

    uint64_t starting_time = mem->start();
    debug("main") << "running for" << settings.run_time << "ms";
    std::this_thread::sleep_for(std::chrono::milliseconds(settings.run_time));
    /*Thread::Sleep(settings.run_time/2);
      test_many_injections(mem,
      argc > 2 ? atoi(argv[2]) : 100, // sampling period in ms
      argc > 3 ? atoi(argv[3]) : 600, // number of batches
      argc > 4 ? atoi(argv[4]) : 66); // number of objects per batch
      Thread::Sleep(settings.run_time/2);*/
    debug("main") << "shutting rMem down...";
    mem->stop();

    if (settings.get_objects) {
        //TimeProbe probe;
        //probe.set();
        r_comp::Image *image = mem->get_objects();
        //probe.check();
        image->object_names.symbols = image->object_names.symbols;

        if (settings.write_objects) {
            write_to_file(image, settings.objects_path, settings.test_objects ? &decompiler : nullptr, starting_time);
        }

        if (settings.decompile_objects && (!settings.write_objects || !settings.test_objects)) {
            if (settings.decompile_to_file) { // argv[2] is a file to redirect the decompiled code to.
                std::ofstream outfile;
                outfile.open(settings.decompilation_file_path.c_str(), std::ios_base::trunc);
                std::streambuf *coutbuf = std::cout.rdbuf(outfile.rdbuf());
                decompile(decompiler, image, starting_time, settings.ignore_named_objects);
                std::cout.rdbuf(coutbuf);
                outfile.close();
            } else {
                decompile(decompiler, image, starting_time, settings.ignore_named_objects);
            }
        }

        delete image;
        //std::cout<<"get_image(): "<<probe.us()<<"us"<<std::endl;
    }

    if (settings.get_models) {
        //TimeProbe probe;
        //probe.set();
        r_comp::Image *image = mem->get_models();
        //probe.check();
        image->object_names.symbols = image->object_names.symbols;

        if (settings.write_models) {
            write_to_file(image, settings.models_path, settings.test_models ? &decompiler : nullptr, starting_time);
        }

        if (settings.decompile_models && (!settings.write_models || !settings.test_models)) {
            if (argc > 2) { // argv[2] is a file to redirect the decompiled code to.
                std::ofstream outfile;
                outfile.open(argv[2], std::ios_base::trunc);
                std::streambuf *coutbuf = std::cout.rdbuf(outfile.rdbuf());
                decompile(decompiler, image, starting_time, settings.ignore_named_models);
                std::cout.rdbuf(coutbuf);
                outfile.close();
            } else {
                decompile(decompiler, image, starting_time, settings.ignore_named_models);
            }
        }

        delete image;
        //std::cout<<"get_models(): "<<probe.us()<<"us"<<std::endl;
    }
    RepliStruct::cleanup();

    delete mem;
#if defined(WIN32) || defined(WIN64)
    r_exec::PipeOStream::Close();
#endif
    return 0;
}